

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(unsigned_long_long lhs,
         SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short in_SI;
  unsigned_long_long in_RDI;
  unsigned_long_long ret;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  undefined6 in_stack_ffffffffffffffd8;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *this;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_12;
  unsigned_long_long local_10;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_4;
  unsigned_short local_2;
  
  local_10 = in_RDI;
  local_4.m_int = in_SI;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_12);
  bVar1 = DivisionCornerCaseHelper<unsigned_short,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1(local_10,local_4,&local_12);
  if (bVar1) {
    local_2 = local_12.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_short,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::DivisionCornerCase2(local_10,local_4,&local_12);
    if (bVar1) {
      local_2 = local_12.m_int;
    }
    else {
      this = (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)0x0;
      uVar2 = SafeInt::operator_cast_to_unsigned_short
                        ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)0x0);
      DivisionHelper<unsigned_long_long,unsigned_short,0>::
      DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                ((unsigned_long_long *)this,
                 (unsigned_short *)CONCAT26(uVar2,in_stack_ffffffffffffffd8),
                 (unsigned_long_long *)0x17b557);
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<unsigned_long_long>
                (this,(unsigned_long_long *)CONCAT26(uVar2,in_stack_ffffffffffffffd8));
    }
  }
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )local_2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}